

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_fluidsynth_mididevice.cpp
# Opt level: O0

int __thiscall FluidSynthMIDIDevice::LoadPatchSets(FluidSynthMIDIDevice *this,char *patches)

{
  fluid_synth_t *pfVar1;
  int iVar2;
  char *__s;
  _func_int_fluid_synth_t_ptr_char_ptr_int *p_Var3;
  char *pcVar4;
  FString local_50;
  FString local_48;
  FString path;
  char *delim;
  char *tok;
  char *wpatches;
  int count;
  char *patches_local;
  FluidSynthMIDIDevice *this_local;
  
  __s = strdup(patches);
  path.Chars = ":";
  if (__s == (char *)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    delim = strtok(__s,":");
    wpatches._4_4_ = 0;
    while (delim != (char *)0x0) {
      FString::FString(&local_48);
      NicePath((char *)&local_50);
      FString::operator=(&local_48,&local_50);
      FString::~FString(&local_50);
      p_Var3 = ::TReqProc::operator_cast_to_function_pointer((TReqProc *)&fluid_synth_sfload);
      pfVar1 = this->FluidSynth;
      pcVar4 = FString::operator_cast_to_char_(&local_48);
      iVar2 = (*p_Var3)(pfVar1,pcVar4,SUB14(wpatches._4_4_ == 0,0));
      if (iVar2 == -1) {
        DPrintf(1,"Failed to load patch set %s.\n",delim);
      }
      else {
        DPrintf(3,"Loaded patch set %s.\n",delim);
        wpatches._4_4_ = wpatches._4_4_ + 1;
      }
      delim = strtok((char *)0x0,":");
      FString::~FString(&local_48);
    }
    free(__s);
    this_local._4_4_ = wpatches._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

int FluidSynthMIDIDevice::LoadPatchSets(const char *patches)
{
	int count;
	char *wpatches = strdup(patches);
	char *tok;
#ifdef _WIN32
	const char *const delim = ";";
#else
	const char *const delim = ":";
#endif

	if (wpatches == NULL)
	{
		return 0;
	}
	tok = strtok(wpatches, delim);
	count = 0;
	while (tok != NULL)
	{
		FString path;
#ifdef _WIN32
		// If the path does not contain any path separators, automatically
		// prepend $PROGDIR to the path.
		if (strcspn(tok, ":/\\") == strlen(tok))
		{
			path << "$PROGDIR/" << tok;
			path = NicePath(path);
		}
		else
#endif
		{
			path = NicePath(tok);
		}
		if (FLUID_FAILED != fluid_synth_sfload(FluidSynth, path, count == 0))
		{
			DPrintf(DMSG_NOTIFY, "Loaded patch set %s.\n", tok);
			count++;
		}
		else
		{
			DPrintf(DMSG_ERROR, "Failed to load patch set %s.\n", tok);
		}
		tok = strtok(NULL, delim);
	}
	free(wpatches);
	return count;
}